

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<google::protobuf::UnknownField>::ExtractSubrange
          (RepeatedField<google::protobuf::UnknownField> *this,int start,int num,
          UnknownField *elements)

{
  undefined8 *puVar1;
  ulong uVar2;
  undefined8 uVar3;
  int iVar4;
  char *pcVar5;
  Nonnull<const_char_*> pcVar6;
  long lVar7;
  int iVar8;
  
  if (start < 0) {
    pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       ((long)start,0,"start >= 0");
  }
  else {
    pcVar6 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar6 == (Nonnull<const_char_*>)0x0) {
    if (num < 0) {
      pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         ((long)num,0,"num >= 0");
    }
    else {
      pcVar6 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar6 == (Nonnull<const_char_*>)0x0) {
      uVar2 = (this->soo_rep_).field_0.long_rep.elements_int;
      iVar4 = internal::SooRep::size(&this->soo_rep_,(uVar2 & 4) == 0);
      iVar8 = start + num;
      if (iVar4 < iVar8) {
        pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           ((long)iVar8,(long)iVar4,"start + num <= old_size");
      }
      else {
        pcVar6 = (Nonnull<const_char_*>)0x0;
      }
      if (pcVar6 == (Nonnull<const_char_*>)0x0) {
        if ((uVar2 & 4) == 0) {
          pcVar5 = (char *)((long)&(this->soo_rep_).field_0 + 8);
        }
        else {
          pcVar5 = internal::LongSooRep::elements((LongSooRep *)this);
        }
        if (0 < num && elements != (UnknownField *)0x0) {
          lVar7 = 0;
          do {
            uVar3 = *(undefined8 *)(pcVar5 + lVar7 + (long)start * 0x10 + 8);
            puVar1 = (undefined8 *)((long)&elements->number_ + lVar7);
            *puVar1 = *(undefined8 *)(pcVar5 + lVar7 + (long)start * 0x10);
            puVar1[1] = uVar3;
            lVar7 = lVar7 + 0x10;
          } while ((ulong)(uint)num << 4 != lVar7);
        }
        if (0 < num) {
          if (iVar8 < iVar4) {
            lVar7 = (long)iVar8;
            pcVar5 = pcVar5 + lVar7 * 0x10;
            do {
              uVar3 = *(undefined8 *)(pcVar5 + 8);
              *(undefined8 *)(pcVar5 + (ulong)(uint)num * -0x10) = *(undefined8 *)pcVar5;
              *(undefined8 *)(pcVar5 + (ulong)(uint)num * -0x10 + 8) = uVar3;
              lVar7 = lVar7 + 1;
              pcVar5 = pcVar5 + 0x10;
            } while (lVar7 < iVar4);
          }
          Truncate(this,iVar4 - num);
          return;
        }
        return;
      }
      goto LAB_0031877e;
    }
  }
  else {
    ExtractSubrange();
  }
  ExtractSubrange();
LAB_0031877e:
  ExtractSubrange();
}

Assistant:

void RepeatedField<Element>::ExtractSubrange(int start, int num,
                                             Element* elements) {
  ABSL_DCHECK_GE(start, 0);
  ABSL_DCHECK_GE(num, 0);
  const bool is_soo = this->is_soo();
  const int old_size = size(is_soo);
  ABSL_DCHECK_LE(start + num, old_size);
  Element* elem = unsafe_elements(is_soo);

  // Save the values of the removed elements if requested.
  if (elements != nullptr) {
    for (int i = 0; i < num; ++i) elements[i] = std::move(elem[i + start]);
  }

  // Slide remaining elements down to fill the gap.
  if (num > 0) {
    for (int i = start + num; i < old_size; ++i)
      elem[i - num] = std::move(elem[i]);
    Truncate(old_size - num);
  }
}